

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.cpp
# Opt level: O0

bool nullcInitDynamicModule(Linker *linker)

{
  nullres nVar1;
  Linker *linker_local;
  
  NULLCDynamic::linker = linker;
  nVar1 = nullcBindModuleFunctionHelper<void,NULLCRef,NULLCRef>
                    ("std.dynamic",NULLCDynamic::OverrideFunction,"override",0);
  if (nVar1 == '\0') {
    linker_local._7_1_ = false;
  }
  else {
    nVar1 = nullcBindModuleFunctionHelper<void,NULLCRef,NULLCArray>
                      ("std.dynamic",NULLCDynamic::Override,"override",1);
    if (nVar1 == '\0') {
      linker_local._7_1_ = false;
    }
    else {
      linker_local._7_1_ = true;
    }
  }
  return linker_local._7_1_;
}

Assistant:

bool	nullcInitDynamicModule(Linker* linker)
{
	NULLCDynamic::linker = linker;

	REGISTER_FUNC(OverrideFunction, "override", 0);
	REGISTER_FUNC(Override, "override", 1);

	return true;
}